

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall
chrono::ChBody::IntStateScatter
          (ChBody *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T,bool full_update)

{
  ChBodyFrame *this_00;
  ChVector<double> local_a0;
  ChState *local_88;
  ulong local_80;
  long local_70;
  ChCoordsys<double> local_68;
  
  local_80 = (ulong)off_x;
  local_a0.m_data[0] =
       (double)((x->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               local_80);
  local_70 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_a0.m_data[1] = 3.45845952088873e-323;
  local_88 = x;
  if ((long)local_80 <= local_70 + -7) {
    this_00 = &this->super_ChBodyFrame;
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_68,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_a0,(type *)0x0);
    ChFrame<double>::SetCoord((ChFrame<double> *)this_00,&local_68);
    local_68.rot.m_data[1] = (double)(ulong)off_v;
    local_68.pos.m_data[0] =
         (double)((v->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 (long)local_68.rot.m_data[1]);
    local_68.rot.m_data[3] =
         (double)(v->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_68.pos.m_data[1] = 1.48219693752374e-323;
    local_68.rot.m_data[0] = (double)v;
    if ((long)local_68.rot.m_data[1] <= (long)local_68.rot.m_data[3] + -3) {
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_a0,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_68,(type *)0x0);
      (*(this_00->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[7])
                (this_00,&local_a0);
      local_68.rot.m_data[1] = (double)(ulong)(off_v + 3);
      local_68.pos.m_data[0] =
           (double)((v->super_ChVectorDynamic<double>).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + (long)local_68.rot.m_data[1]);
      local_68.rot.m_data[3] =
           (double)(v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_68.pos.m_data[1] = 1.48219693752374e-323;
      local_68.rot.m_data[0] = (double)v;
      if ((long)local_68.rot.m_data[1] <= (long)local_68.rot.m_data[3] + -3) {
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&local_a0,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_68,(type *)0x0);
        (*(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame
          [9])(this_00,&local_a0);
        (this->super_ChPhysicsItem).super_ChObj.ChTime = T;
        (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])(this,(ulong)full_update);
        return;
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChBody::IntStateScatter(const unsigned int off_x,  // offset in x state vector
                             const ChState& x,          // state vector, position part
                             const unsigned int off_v,  // offset in v state vector
                             const ChStateDelta& v,     // state vector, speed part
                             const double T,            // time
                             bool full_update           // perform complete update
) {
    this->SetCoord(x.segment(off_x, 7));
    this->SetPos_dt(v.segment(off_v + 0, 3));
    this->SetWvel_loc(v.segment(off_v + 3, 3));
    this->SetChTime(T);
    this->Update(T, full_update);
}